

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::Capturer
          (Capturer *this,StringRef *macroName,SourceLineInfo *lineInfo,OfType resultType,
          StringRef *names)

{
  IResultCapture *pIVar1;
  StringRef *pSVar2;
  reference pvVar3;
  anon_class_8_1_a855c668 *in_RSI;
  StringRef *in_RDI;
  StringRef *in_R8;
  char c;
  size_t pos;
  stack<char,_std::deque<char,_std::allocator<char>_>_> openings;
  size_t start;
  anon_class_8_1_a855c668 trimmed;
  value_type *in_stack_fffffffffffffe88;
  string *this_00;
  StringRef *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  SourceLineInfo *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  StringRef *this_01;
  StringRef *this_02;
  string local_100 [56];
  string local_c8 [39];
  char local_a1;
  StringRef *local_a0;
  StringRef *local_48;
  
  this_02 = in_RDI;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x124bf2);
  pIVar1 = getResultCapture();
  in_RDI[1].m_start = (char *)pIVar1;
  this_02[1].m_size = 0;
  local_48 = (StringRef *)0x0;
  std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>
            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)in_stack_fffffffffffffe90);
  local_a0 = (StringRef *)0x0;
  do {
    this_01 = local_a0;
    pSVar2 = (StringRef *)StringRef::size(in_R8);
    if (pSVar2 <= this_01) {
      std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
      emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)this_01,
                 (StringRef *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 in_stack_fffffffffffffea0,(OfType *)in_stack_fffffffffffffe98);
      pSVar2 = local_48;
      StringRef::size(in_R8);
      Capturer::anon_class_8_1_a855c668::operator()
                (in_RSI,(size_t)this_01,
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      StringRef::operator_cast_to_string(this_02);
      pvVar3 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::back
                         ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)pSVar2)
      ;
      this_00 = local_100;
      std::__cxx11::string::operator=((string *)&pvVar3->message,this_00);
      std::__cxx11::string::~string(this_00);
      StringRef::~StringRef(pSVar2);
      pvVar3 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::back
                         ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)pSVar2)
      ;
      std::__cxx11::string::operator+=((string *)&pvVar3->message," := ");
      clara::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack
                ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)0x124f69);
      return;
    }
    local_a1 = StringRef::operator[](in_R8,(size_type)local_a0);
    in_stack_fffffffffffffeac = (int)local_a1;
    if (in_stack_fffffffffffffeac == 0x28) goto LAB_00124d14;
    if (in_stack_fffffffffffffeac == 0x29) goto LAB_00124d49;
    if (in_stack_fffffffffffffeac == 0x2c) {
      if ((local_48 != local_a0) &&
         (in_stack_fffffffffffffea0 =
               (SourceLineInfo *)
               clara::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::size
                         ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)0x124d80),
         in_stack_fffffffffffffea0 == (SourceLineInfo *)0x0)) {
        std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
        emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                  ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)this_01,
                   (StringRef *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (SourceLineInfo *)0x0,(OfType *)in_stack_fffffffffffffe98);
        Capturer::anon_class_8_1_a855c668::operator()
                  (in_RSI,(size_t)this_01,
                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        StringRef::operator_cast_to_string(this_02);
        pvVar3 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::back
                           ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                            in_stack_fffffffffffffe90);
        in_stack_fffffffffffffe98 = local_c8;
        std::__cxx11::string::operator=((string *)&pvVar3->message,in_stack_fffffffffffffe98);
        std::__cxx11::string::~string(in_stack_fffffffffffffe98);
        StringRef::~StringRef(in_stack_fffffffffffffe90);
        pvVar3 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::back
                           ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                            in_stack_fffffffffffffe90);
        std::__cxx11::string::operator+=((string *)&pvVar3->message," := ");
        local_48 = local_a0;
      }
    }
    else if (in_stack_fffffffffffffeac == 0x5b) {
LAB_00124d14:
      clara::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::push
                ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88);
    }
    else {
      if (in_stack_fffffffffffffeac != 0x5d) {
        if (in_stack_fffffffffffffeac == 0x7b) goto LAB_00124d14;
        if (in_stack_fffffffffffffeac != 0x7d) goto LAB_00124e88;
      }
LAB_00124d49:
      clara::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::pop
                ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)0x124d56);
    }
LAB_00124e88:
    local_a0 = (StringRef *)
               ((long)&(((_Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                        &local_a0->m_start)->_M_impl).super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(names[start])) {
                ++start;
            }
            while (names[end] == ',' || isspace(names[end])) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case ',':
                if (start != pos && openings.size() == 0) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = trimmed(start, pos);
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.size() == 0 && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = trimmed(start, names.size() - 1);
        m_messages.back().message += " := ";
    }